

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall luna::State::State(State *this)

{
  unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *puVar1;
  _Head_base<0UL,_luna::ModuleManager_*,_false> _Var2;
  StringPool *this_00;
  GC *pGVar3;
  Table *pTVar4;
  _Head_base<0UL,_luna::ModuleManager_*,_false> this_01;
  pointer *__ptr;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *local_68;
  unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  Stack *local_38;
  
  puVar1 = &this->gc_;
  local_38 = &this->stack_;
  *(undefined8 *)
   ((long)&(this->string_pool_)._M_t.
           super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t.
           super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
           super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl + 4) = 0;
  *(undefined8 *)
   ((long)&(this->gc_)._M_t.super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
           super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
           super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl + 4) = 0;
  (this->module_manager_)._M_t.
  super___uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>._M_t.
  super__Tuple_impl<0UL,_luna::ModuleManager_*,_std::default_delete<luna::ModuleManager>_>.
  super__Head_base<0UL,_luna::ModuleManager_*,_false>._M_head_impl = (ModuleManager *)0x0;
  (this->string_pool_)._M_t.
  super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t.
  super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
  super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl = (StringPool *)0x0;
  local_68 = &this->string_pool_;
  local_60 = puVar1;
  Stack::Stack(local_38);
  (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->calls_;
  (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->calls_;
  (this->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
  _M_size = 0;
  (this->global_).field_0.obj_ = (GCObject *)0x0;
  (this->global_).type_ = ValueT_Nil;
  this_00 = (StringPool *)operator_new(0x70);
  StringPool::StringPool(this_00);
  std::__uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>::reset
            ((__uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_> *)
             &this->string_pool_,this_00);
  pGVar3 = (GC *)operator_new(0x2e0);
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(luna::GCObject_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp:22:26)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(luna::GCObject_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp:22:26)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  GC::GC(pGVar3,(GCObjectDeleter *)&local_88,false);
  std::__uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>::reset
            ((__uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_> *)puVar1,pGVar3);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  pGVar3 = (puVar1->_M_t).super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
           super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
           super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  *(code **)local_88._M_unused._0_8_ = FullGCRoot;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(State **)((long)local_88._M_unused._0_8_ + 0x10) = this;
  local_70 = std::
             _Function_handler<void_(luna::GCObjectVisitor_*),_std::_Bind<void_(luna::State::*(luna::State_*,_std::_Placeholder<1>))(luna::GCObjectVisitor_*)>_>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(luna::GCObjectVisitor_*),_std::_Bind<void_(luna::State::*(luna::State_*,_std::_Placeholder<1>))(luna::GCObjectVisitor_*)>_>
             ::_M_manager;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = FullGCRoot;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(State **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  local_40 = std::
             _Function_handler<void_(luna::GCObjectVisitor_*),_std::_Bind<void_(luna::State::*(luna::State_*,_std::_Placeholder<1>))(luna::GCObjectVisitor_*)>_>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(luna::GCObjectVisitor_*),_std::_Bind<void_(luna::State::*(luna::State_*,_std::_Placeholder<1>))(luna::GCObjectVisitor_*)>_>
             ::_M_manager;
  GC::SetRootTraveller(pGVar3,(RootTravelType *)&local_88,(RootTravelType *)&local_58);
  puVar1 = local_60;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  pTVar4 = GC::NewTable((puVar1->_M_t).
                        super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
                        super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
                        super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl,GCGen0);
  (this->global_).field_0.table_ = pTVar4;
  (this->global_).type_ = ValueT_Table;
  local_88._8_4_ = 4;
  local_88._M_unused._M_object = GetString(this,"__metatables");
  local_58._8_4_ = 7;
  local_58._M_unused._M_object =
       GC::NewTable((puVar1->_M_t).super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>.
                    _M_t.super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
                    super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl,GCGen0);
  Table::SetValue((this->global_).field_0.table_,(Value *)&local_88,(Value *)&local_58);
  local_88._8_4_ = 4;
  local_88._M_unused._M_object = GetString(this,"__modules");
  local_58._8_4_ = 7;
  local_58._M_unused._M_object =
       GC::NewTable((puVar1->_M_t).super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>.
                    _M_t.super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
                    super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl,GCGen0);
  Table::SetValue((this->global_).field_0.table_,(Value *)&local_88,(Value *)&local_58);
  this_01._M_head_impl = (ModuleManager *)operator_new(0x10);
  ModuleManager::ModuleManager(this_01._M_head_impl,this,(Table *)local_58._M_unused._0_8_);
  _Var2._M_head_impl =
       (this->module_manager_)._M_t.
       super___uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>._M_t.
       super__Tuple_impl<0UL,_luna::ModuleManager_*,_std::default_delete<luna::ModuleManager>_>.
       super__Head_base<0UL,_luna::ModuleManager_*,_false>._M_head_impl;
  (this->module_manager_)._M_t.
  super___uniq_ptr_impl<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>._M_t.
  super__Tuple_impl<0UL,_luna::ModuleManager_*,_std::default_delete<luna::ModuleManager>_>.
  super__Head_base<0UL,_luna::ModuleManager_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var2._M_head_impl != (ModuleManager *)0x0) {
    operator_delete(_Var2._M_head_impl);
  }
  return;
}

Assistant:

State::State()
    {
        string_pool_.reset(new StringPool);

        // Init GC
        gc_.reset(new GC([&](GCObject *obj, unsigned int type) {
            if (type == GCObjectType_String)
            {
                string_pool_->DeleteString(static_cast<String *>(obj));
            }
            delete obj;
        }));
        auto root = std::bind(&State::FullGCRoot, this, std::placeholders::_1);
        gc_->SetRootTraveller(root, root);

        // New global table
        global_.table_ = NewTable();
        global_.type_ = ValueT_Table;

        // New table for store metatables
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(METATABLES);
        Value v;
        v.type_ = ValueT_Table;
        v.table_ = NewTable();
        global_.table_->SetValue(k, v);

        // New table for store modules
        k.type_ = ValueT_String;
        k.str_ = GetString(MODULES_TABLE);
        v.type_ = ValueT_Table;
        v.table_ = NewTable();
        global_.table_->SetValue(k, v);

        // Init module manager
        module_manager_.reset(new ModuleManager(this, v.table_));
    }